

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDBusMenuItem>::emplace<QDBusMenuItem>
          (QMovableArrayOps<QDBusMenuItem> *this,qsizetype i,QDBusMenuItem *args)

{
  QDBusMenuItem **ppQVar1;
  qsizetype *pqVar2;
  int iVar3;
  Data *pDVar4;
  QDBusMenuItem *pQVar5;
  long lVar6;
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar7;
  qsizetype qVar8;
  totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
  __old_val;
  long in_FS_OFFSET;
  bool bVar9;
  Inserter local_70;
  int local_48;
  undefined4 uStack_44;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  QStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size ==
        i) {
      qVar8 = QArrayDataPointer<QDBusMenuItem>::freeSpaceAtEnd
                        ((QArrayDataPointer<QDBusMenuItem> *)this);
      if (qVar8 == 0) goto LAB_0059704c;
      pQVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
      lVar6 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
      pQVar5[lVar6].m_id = args->m_id;
      pQVar7 = (args->m_properties).d.d.ptr;
      (args->m_properties).d.d.ptr =
           (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
            *)0x0;
      pQVar5[lVar6].m_properties.d.d.ptr = pQVar7;
LAB_0059714a:
      pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>
                .size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_005970fe;
    }
LAB_0059704c:
    if (i == 0) {
      qVar8 = QArrayDataPointer<QDBusMenuItem>::freeSpaceAtBegin
                        ((QArrayDataPointer<QDBusMenuItem> *)this);
      if (qVar8 != 0) {
        pQVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).
                 super_QArrayDataPointer<QDBusMenuItem>.ptr;
        pQVar5[-1].m_id = args->m_id;
        pQVar7 = (args->m_properties).d.d.ptr;
        (args->m_properties).d.d.ptr =
             (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
              *)0x0;
        pQVar5[-1].m_properties.d.d.ptr = pQVar7;
        ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).
                   super_QArrayDataPointer<QDBusMenuItem>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0059714a;
      }
    }
  }
  QStack_40.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
        )&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = args->m_id;
  _local_48 = CONCAT44(0xaaaaaaaa,iVar3);
  pQVar7 = (args->m_properties).d.d.ptr;
  (args->m_properties).d.d.ptr =
       (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
        *)0x0;
  bVar9 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.size
          != 0;
  QArrayDataPointer<QDBusMenuItem>::detachAndGrow
            ((QArrayDataPointer<QDBusMenuItem> *)this,(uint)(i == 0 && bVar9),1,
             (QDBusMenuItem **)0x0,(QArrayDataPointer<QDBusMenuItem> *)0x0);
  if (i == 0 && bVar9) {
    pQVar5 = (this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
             ptr;
    pQVar5[-1].m_id = iVar3;
    pQVar5[-1].m_properties.d.d.ptr = pQVar7;
    ppQVar1 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
               ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QDBusMenuItem>).super_QArrayDataPointer<QDBusMenuItem>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QDBusMenuItem> *)this,i,1);
    (local_70.displaceFrom)->m_id = iVar3;
    ((local_70.displaceFrom)->m_properties).d.d.ptr = pQVar7;
    local_70.displaceFrom = local_70.displaceFrom + 1;
    (local_70.data)->size = (local_70.data)->size + local_70.nInserts;
  }
  QStack_40.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_*>
        )(QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
          *)0x0;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&QStack_40);
LAB_005970fe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }